

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn_graph.h
# Opt level: O3

void __thiscall gnns::Knn_Graph<L2Distance<float>_>::~Knn_Graph(Knn_Graph<L2Distance<float>_> *this)

{
  uint *puVar1;
  float *pfVar2;
  
  puVar1 = (this->indices).data;
  if (puVar1 != (uint *)0x0) {
    operator_delete__(puVar1);
  }
  pfVar2 = (this->distances).data;
  if (pfVar2 != (float *)0x0) {
    operator_delete__(pfVar2);
    return;
  }
  return;
}

Assistant:

~Knn_Graph()
        {
            if(indices.ptr())
                delete[] indices.ptr();
            if(distances.ptr())
                delete[] distances.ptr();
        }